

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_insert.cpp
# Opt level: O2

void duckdb::CheckInsertColumnCountMismatch
               (idx_t expected_columns,idx_t result_columns,bool columns_provided,char *tname)

{
  BinderException *this;
  char *pcVar1;
  unsigned_long in_R9;
  allocator local_59;
  Exception local_58 [2];
  string msg;
  
  if (result_columns == expected_columns) {
    return;
  }
  pcVar1 = "table %s has %lld columns but %lld values were supplied";
  if (columns_provided) {
    pcVar1 = 
    "Column name/value mismatch for insert on %s: expected %lld columns but %lld values were supplied"
    ;
  }
  ::std::__cxx11::string::string((string *)local_58,pcVar1,&local_59);
  Exception::ConstructMessage<char_const*,unsigned_long,unsigned_long>
            (&msg,local_58,(string *)tname,(char *)expected_columns,result_columns,in_R9);
  ::std::__cxx11::string::~string((string *)local_58);
  this = (BinderException *)__cxa_allocate_exception(0x10);
  BinderException::BinderException(this,&msg);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void CheckInsertColumnCountMismatch(idx_t expected_columns, idx_t result_columns, bool columns_provided,
                                           const char *tname) {
	if (result_columns != expected_columns) {
		string msg = StringUtil::Format(!columns_provided ? "table %s has %lld columns but %lld values were supplied"
		                                                  : "Column name/value mismatch for insert on %s: "
		                                                    "expected %lld columns but %lld values were supplied",
		                                tname, expected_columns, result_columns);
		throw BinderException(msg);
	}
}